

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall
Scene<char>::add<SimpleMesh<SimpleVertex>,SimpleVertex,CharShader,myTexture>
          (Scene<char> *this,
          Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture> *o)

{
  ObjectInfo **__args_4;
  tuple<myTexture> *this_00;
  ObjectInfo *__args_3;
  Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture> *in_RSI;
  long in_RDI;
  Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture> *in_stack_ffffffffffffff68;
  vector<std::unique_ptr<DedicatedPipeline<char>,_std::default_delete<DedicatedPipeline<char>_>_>,_std::allocator<std::unique_ptr<DedicatedPipeline<char>,_std::default_delete<DedicatedPipeline<char>_>_>_>_>
  *this_01;
  tuple<myTexture> *in_stack_ffffffffffffff98;
  CharShader *in_stack_ffffffffffffffa0;
  vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_>
  *in_stack_ffffffffffffffa8;
  vector<std::unique_ptr<DedicatedPipeline<char>,_std::default_delete<DedicatedPipeline<char>_>_>,_std::allocator<std::unique_ptr<DedicatedPipeline<char>,_std::default_delete<DedicatedPipeline<char>_>_>_>_>
  local_18;
  
  __args_4 = (ObjectInfo **)(in_RDI + 0x98);
  local_18.
  super__Vector_base<std::unique_ptr<DedicatedPipeline<char>,_std::default_delete<DedicatedPipeline<char>_>_>,_std::allocator<std::unique_ptr<DedicatedPipeline<char>,_std::default_delete<DedicatedPipeline<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_RSI;
  Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>::getMeshes
            (in_stack_ffffffffffffff68);
  Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>::getShader
            ((Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture> *)
             local_18.
             super__Vector_base<std::unique_ptr<DedicatedPipeline<char>,_std::default_delete<DedicatedPipeline<char>_>_>,_std::allocator<std::unique_ptr<DedicatedPipeline<char>,_std::default_delete<DedicatedPipeline<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  this_00 = Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>::getTextures
                      ((Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture> *)
                       local_18.
                       super__Vector_base<std::unique_ptr<DedicatedPipeline<char>,_std::default_delete<DedicatedPipeline<char>_>_>,_std::allocator<std::unique_ptr<DedicatedPipeline<char>,_std::default_delete<DedicatedPipeline<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>::getBoundingSpheres
            (in_stack_ffffffffffffff68);
  __args_3 = Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>::getInfo
                       ((Object<SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture> *)
                        local_18.
                        super__Vector_base<std::unique_ptr<DedicatedPipeline<char>,_std::default_delete<DedicatedPipeline<char>_>_>,_std::allocator<std::unique_ptr<DedicatedPipeline<char>,_std::default_delete<DedicatedPipeline<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
  std::
  make_unique<DedicatedPipelineImpl<char,SimpleMesh<SimpleVertex>,SimpleVertex,CharShader,myTexture>,std::vector<SimpleMesh<SimpleVertex>,std::allocator<SimpleMesh<SimpleVertex>>>,CharShader,std::tuple<myTexture>const&,std::vector<bounding_sphere,std::allocator<bounding_sphere>>,ObjectInfo*>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (vector<bounding_sphere,_std::allocator<bounding_sphere>_> *)__args_3,__args_4);
  this_01 = &local_18;
  std::unique_ptr<DedicatedPipeline<char>,std::default_delete<DedicatedPipeline<char>>>::
  unique_ptr<DedicatedPipelineImpl<char,SimpleMesh<SimpleVertex>,SimpleVertex,CharShader,myTexture>,std::default_delete<DedicatedPipelineImpl<char,SimpleMesh<SimpleVertex>,SimpleVertex,CharShader,myTexture>>,void>
            ((unique_ptr<DedicatedPipeline<char>,_std::default_delete<DedicatedPipeline<char>_>_> *)
             this_00,(unique_ptr<DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>,_std::default_delete<DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>_>_>
                      *)__args_3);
  std::
  vector<std::unique_ptr<DedicatedPipeline<char>,_std::default_delete<DedicatedPipeline<char>_>_>,_std::allocator<std::unique_ptr<DedicatedPipeline<char>,_std::default_delete<DedicatedPipeline<char>_>_>_>_>
  ::push_back(this_01,(value_type *)in_stack_ffffffffffffff68);
  std::unique_ptr<DedicatedPipeline<char>,_std::default_delete<DedicatedPipeline<char>_>_>::
  ~unique_ptr((unique_ptr<DedicatedPipeline<char>,_std::default_delete<DedicatedPipeline<char>_>_> *
              )this_00);
  std::
  unique_ptr<DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>,_std::default_delete<DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>_>_>
  ::~unique_ptr((unique_ptr<DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>,_std::default_delete<DedicatedPipelineImpl<char,_SimpleMesh<SimpleVertex>,_SimpleVertex,_CharShader,_myTexture>_>_>
                 *)this_01);
  std::vector<bounding_sphere,_std::allocator<bounding_sphere>_>::~vector
            ((vector<bounding_sphere,_std::allocator<bounding_sphere>_> *)this_00);
  std::vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_>::~vector
            ((vector<SimpleMesh<SimpleVertex>,_std::allocator<SimpleMesh<SimpleVertex>_>_> *)this_00
            );
  return;
}

Assistant:

void add(const Object<Mesh, Vertex, Shader, Texture...> &o) {
        // Creates the dedicated pipeline for the new object and adds it to the vector
        pipelines.push_back(
                std::make_unique<DedicatedPipelineImpl<target_t, Mesh, Vertex, Shader, Texture...>>(o.getMeshes(),
                                                                                                    o.getShader(),
                                                                                                    o.getTextures(),
                                                                                                    o.getBoundingSpheres(),
                                                                                                    o.getInfo()));
    }